

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

Pass * wasm::createRemoveUnusedModuleElementsPass(void)

{
  RemoveUnusedModuleElements *this;
  
  this = (RemoveUnusedModuleElements *)operator_new(0x60);
  RemoveUnusedModuleElements::RemoveUnusedModuleElements(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createRemoveUnusedModuleElementsPass() {
  return new RemoveUnusedModuleElements(false);
}